

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::GlobFunctionBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::GlobFunctionBindData_*,_false> _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  ClientContext *context_00;
  reference pvVar4;
  pointer pGVar5;
  _Head_base<0UL,_duckdb::GlobFunctionBindData_*,_false> local_58;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_50;
  _Alloc_hider local_48;
  _Alloc_hider _Stack_40;
  
  local_58._M_head_impl = (GlobFunctionBindData *)operator_new(0x30);
  ((local_58._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)0x0;
  ((local_58._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_58._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_58._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_58._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__GlobFunctionBindData_0243e560;
  ((local_58._M_head_impl)->file_list).internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ((local_58._M_head_impl)->file_list).internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MultiFileReader::Create((MultiFileReader *)&local_50,input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)&local_50);
  pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&local_48,context_00,(Value *)context,(FileGlobOptions)pvVar4);
  pGVar5 = unique_ptr<duckdb::GlobFunctionBindData,_std::default_delete<duckdb::GlobFunctionBindData>,_true>
           ::operator->((unique_ptr<duckdb::GlobFunctionBindData,_std::default_delete<duckdb::GlobFunctionBindData>,_true>
                         *)&local_58);
  _Var3._M_p = _Stack_40._M_p;
  _Var2._M_p = local_48._M_p;
  local_48._M_p = (pointer)0x0;
  _Stack_40._M_p = (pointer)0x0;
  this_00 = (pGVar5->file_list).internal.
            super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pGVar5->file_list).internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)_Var2._M_p;
  (pGVar5->file_list).internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_p);
    }
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [5])0x1de54a4);
  _Var1._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (GlobFunctionBindData *)0x0;
  *(GlobFunctionBindData **)this = _Var1._M_head_impl;
  if (local_50._M_head_impl != (MultiFileReader *)0x0) {
    (*(local_50._M_head_impl)->_vptr_MultiFileReader[1])();
    if (local_58._M_head_impl != (GlobFunctionBindData *)0x0) {
      (*((local_58._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> GlobFunctionBind(ClientContext &context, TableFunctionBindInput &input,
                                                 vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<GlobFunctionBindData>();
	auto multi_file_reader = MultiFileReader::Create(input.table_function);
	result->file_list = multi_file_reader->CreateFileList(context, input.inputs[0], FileGlobOptions::ALLOW_EMPTY);
	return_types.emplace_back(LogicalType::VARCHAR);
	names.emplace_back("file");
	return std::move(result);
}